

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O3

Scale * __thiscall icu_63::number::Scale::operator=(Scale *this,Scale *other)

{
  DecNum *this_00;
  UErrorCode localStatus;
  UErrorCode local_1c;
  
  this->fMagnitude = other->fMagnitude;
  if (other->fArbitrary == (DecNum *)0x0) {
    this->fArbitrary = (DecNum *)0x0;
  }
  else {
    local_1c = U_ZERO_ERROR;
    this_00 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)other);
    if (this_00 != (DecNum *)0x0) {
      impl::DecNum::DecNum(this_00,other->fArbitrary,&local_1c);
    }
    this->fArbitrary = this_00;
  }
  this->fError = other->fError;
  return this;
}

Assistant:

Scale& Scale::operator=(const Scale& other) {
    fMagnitude = other.fMagnitude;
    if (other.fArbitrary != nullptr) {
        UErrorCode localStatus = U_ZERO_ERROR;
        fArbitrary = new DecNum(*other.fArbitrary, localStatus);
    } else {
        fArbitrary = nullptr;
    }
    fError = other.fError;
    return *this;
}